

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

void __thiscall cmsys::CommandLineArguments::GenerateHelp(CommandLineArguments *this)

{
  char *pcVar1;
  undefined1 *puVar2;
  iterator iVar3;
  _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
  *p_Var4;
  _Base_ptr p_Var5;
  Internal *pIVar6;
  iterator __position;
  _Rb_tree_node_base *p_Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  char cVar14;
  _Self __tmp_1;
  ulong uVar15;
  ulong uVar16;
  _Self __tmp;
  _Base_ptr p_Var17;
  char *__s;
  _Self __tmp_2;
  int iVar18;
  string argument;
  MapArgs mp;
  _Self __tmp_4;
  ostringstream str;
  long *local_230 [2];
  long local_220 [2];
  undefined1 *local_210;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
  local_1e8;
  _Rb_tree_node_base *local_1b8;
  long local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar6 = this->Internals;
  p_Var5 = *(_Base_ptr *)
            ((long)&(pIVar6->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 !=
      &(pIVar6->Callbacks).
       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_230,(char *)p_Var5[3]._M_left,(allocator<char> *)&local_208);
      iVar3 = std::
              _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
              ::find(&local_1e8,(key_type *)local_230);
      if (local_230[0] != local_220) {
        operator_delete(local_230[0],local_220[0] + 1);
      }
      p_Var7 = p_Var5 + 1;
      if ((_Rb_tree_header *)iVar3._M_node != &local_1e8._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
        ::_M_insert_unique<cmsys::String_const&>
                  ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                    *)(iVar3._M_node + 2),(String *)p_Var7);
      }
      p_Var4 = (_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                *)std::
                  map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                  ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                                *)&local_1e8,(key_type *)p_Var7);
      std::
      _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
      ::_M_insert_unique<cmsys::String_const&>(p_Var4,(String *)p_Var7);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      pIVar6 = this->Internals;
    } while ((_Rb_tree_header *)p_Var5 !=
             &(pIVar6->Callbacks).
              super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ._M_t._M_impl.super__Rb_tree_header);
    p_Var5 = *(_Base_ptr *)
              ((long)&(pIVar6->Callbacks).
                      super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  if ((_Rb_tree_header *)p_Var5 !=
      &(pIVar6->Callbacks).
       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_230,(char *)p_Var5[3]._M_left,(allocator<char> *)&local_208);
      iVar3 = std::
              _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
              ::find(&local_1e8,(key_type *)local_230);
      if (local_230[0] != local_220) {
        operator_delete(local_230[0],local_220[0] + 1);
      }
      p_Var7 = p_Var5 + 1;
      if ((_Rb_tree_header *)iVar3._M_node == &local_1e8._M_impl.super__Rb_tree_header) {
        p_Var4 = (_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                  *)std::
                    map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                    ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                                  *)&local_1e8,(key_type *)p_Var7);
        std::
        _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
        ::_M_insert_unique<cmsys::String_const&>(p_Var4,(String *)p_Var7);
      }
      else {
        std::
        _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
        ::_M_insert_unique<cmsys::String_const&>
                  ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                    *)(iVar3._M_node + 2),(String *)p_Var7);
        __position = std::
                     _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                     ::find(&local_1e8,(key_type *)p_Var7);
        for (p_Var7 = __position._M_node[2]._M_right;
            p_Var7 != (_Rb_tree_node_base *)&__position._M_node[2]._M_parent;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          std::
          _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
          ::_M_insert_unique<cmsys::String_const&>
                    ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                      *)(iVar3._M_node + 2),(String *)(p_Var7 + 1));
        }
        std::
        _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
        ::_M_erase_aux(&local_1e8,(const_iterator)__position._M_node);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 !=
             &(this->Internals->Callbacks).
              super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ._M_t._M_impl.super__Rb_tree_header);
  }
  p_Var5 = (_Base_ptr)0x0;
  p_Var9 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1e8._M_impl.super__Rb_tree_header) {
    do {
      for (p_Var7 = p_Var9[2]._M_right; p_Var7 != (_Rb_tree_node_base *)&p_Var9[2]._M_parent;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        p_Var17 = p_Var7[1]._M_parent;
        pmVar8 = std::
                 map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                 ::operator[](&(this->Internals->Callbacks).
                               super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                              ,(key_type *)(p_Var7 + 1));
        iVar18 = pmVar8->ArgumentType;
        if (iVar18 == 1) {
          p_Var17 = (_Base_ptr)((long)&p_Var17->_M_color + 3);
        }
        else if ((iVar18 == 2) || (iVar18 == 3)) {
          p_Var17 = (_Base_ptr)&p_Var17->field_0x4;
        }
        if (p_Var5 < p_Var17) {
          p_Var5 = p_Var17;
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != &local_1e8._M_impl.super__Rb_tree_header);
  }
  if ((_Rb_tree_header *)local_1e8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1e8._M_impl.super__Rb_tree_header) {
    local_210 = &p_Var5->field_0x4;
    local_1b0 = -5 - (long)p_Var5;
    p_Var5 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      for (p_Var7 = p_Var5[2]._M_right; p_Var7 != (_Rb_tree_node_base *)&p_Var5[2]._M_parent;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
        local_230[0] = local_220;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        pmVar8 = std::
                 map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                 ::operator[](&(this->Internals->Callbacks).
                               super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                              ,(key_type *)(p_Var7 + 1));
        if (pmVar8->ArgumentType - 1U < 4) {
          std::__cxx11::string::append((char *)local_230);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        std::__cxx11::string::substr((ulong)&local_208,(ulong)local_230);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        if (local_230[0] != local_220) {
          operator_delete(local_230[0],local_220[0] + 1);
        }
      }
      local_1b8 = p_Var5;
      pmVar8 = std::
               map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
               ::operator[](&(this->Internals->Callbacks).
                             super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                            ,(key_type *)(p_Var5 + 1));
      __s = pmVar8->Help;
      sVar11 = strlen(__s);
      if (sVar11 != 0) {
        iVar18 = 0;
        do {
          cVar14 = *__s;
          if (cVar14 != '\0') {
            lVar12 = 1;
            while( true ) {
              if ((cVar14 == ' ') || (cVar14 == '\t')) {
                __s = __s + 1;
                sVar11 = sVar11 - 1;
              }
              if (__s[lVar12] == '\0') break;
              cVar14 = *__s;
              lVar12 = lVar12 + 1;
            }
          }
          puVar2 = local_210;
          if (iVar18 != 0) {
            for (; puVar2 != (undefined1 *)0x0; puVar2 = puVar2 + -1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            }
          }
          uVar13 = (ulong)this->LineLength - (long)local_210;
          uVar16 = sVar11;
          if (uVar13 < sVar11) {
            uVar15 = (ulong)this->LineLength + local_1b0;
            do {
              uVar16 = uVar13;
              if ((uVar15 == 0) || (pcVar1 = __s + uVar15, uVar16 = uVar15, *pcVar1 == ' ')) break;
              uVar15 = uVar15 - 1;
            } while (*pcVar1 != '\t');
          }
          std::ostream::write((char *)local_1a8,(long)__s);
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
          std::ostream::put((char)local_1a8);
          std::ostream::flush();
          __s = __s + uVar16;
          iVar18 = iVar18 + 1;
          sVar11 = sVar11 - uVar16;
        } while (sVar11 != 0);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(local_1b8);
    } while ((_Rb_tree_header *)p_Var5 != &local_1e8._M_impl.super__Rb_tree_header);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->Help,(string *)local_230);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  std::
  _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
  ::~_Rb_tree(&local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CommandLineArguments::GenerateHelp()
{
  std::ostringstream str;

  // Collapse all arguments into the map of vectors of all arguments that do
  // the same thing.
  CommandLineArguments::Internal::CallbacksMap::iterator it;
  using MapArgs = std::map<CommandLineArguments::Internal::String,
                           CommandLineArguments::Internal::SetOfStrings>;
  MapArgs mp;
  MapArgs::iterator mpit, smpit;
  for (it = this->Internals->Callbacks.begin();
       it != this->Internals->Callbacks.end(); it++) {
    CommandLineArgumentsCallbackStructure* cs = &(it->second);
    mpit = mp.find(cs->Help);
    if (mpit != mp.end()) {
      mpit->second.insert(it->first);
      mp[it->first].insert(it->first);
    } else {
      mp[it->first].insert(it->first);
    }
  }
  for (it = this->Internals->Callbacks.begin();
       it != this->Internals->Callbacks.end(); it++) {
    CommandLineArgumentsCallbackStructure* cs = &(it->second);
    mpit = mp.find(cs->Help);
    if (mpit != mp.end()) {
      mpit->second.insert(it->first);
      smpit = mp.find(it->first);
      CommandLineArguments::Internal::SetOfStrings::iterator sit;
      for (sit = smpit->second.begin(); sit != smpit->second.end(); sit++) {
        mpit->second.insert(*sit);
      }
      mp.erase(smpit);
    } else {
      mp[it->first].insert(it->first);
    }
  }

  // Find the length of the longest string
  CommandLineArguments::Internal::String::size_type maxlen = 0;
  for (mpit = mp.begin(); mpit != mp.end(); mpit++) {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for (sit = mpit->second.begin(); sit != mpit->second.end(); sit++) {
      CommandLineArguments::Internal::String::size_type clen = sit->size();
      switch (this->Internals->Callbacks[*sit].ArgumentType) {
        case CommandLineArguments::NO_ARGUMENT:
          clen += 0;
          break;
        case CommandLineArguments::CONCAT_ARGUMENT:
          clen += 3;
          break;
        case CommandLineArguments::SPACE_ARGUMENT:
          clen += 4;
          break;
        case CommandLineArguments::EQUAL_ARGUMENT:
          clen += 4;
          break;
      }
      if (clen > maxlen) {
        maxlen = clen;
      }
    }
  }

  CommandLineArguments::Internal::String::size_type maxstrlen = maxlen;
  maxlen += 4; // For the space before and after the option

  // Print help for each option
  for (mpit = mp.begin(); mpit != mp.end(); mpit++) {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for (sit = mpit->second.begin(); sit != mpit->second.end(); sit++) {
      str << std::endl;
      std::string argument = *sit;
      switch (this->Internals->Callbacks[*sit].ArgumentType) {
        case CommandLineArguments::NO_ARGUMENT:
          break;
        case CommandLineArguments::CONCAT_ARGUMENT:
          argument += "opt";
          break;
        case CommandLineArguments::SPACE_ARGUMENT:
          argument += " opt";
          break;
        case CommandLineArguments::EQUAL_ARGUMENT:
          argument += "=opt";
          break;
        case CommandLineArguments::MULTI_ARGUMENT:
          argument += " opt opt ...";
          break;
      }
      str << "  " << argument.substr(0, maxstrlen) << "  ";
    }
    const char* ptr = this->Internals->Callbacks[mpit->first].Help;
    size_t len = strlen(ptr);
    int cnt = 0;
    while (len > 0) {
      // If argument with help is longer than line length, split it on previous
      // space (or tab) and continue on the next line
      CommandLineArguments::Internal::String::size_type cc;
      for (cc = 0; ptr[cc]; cc++) {
        if (*ptr == ' ' || *ptr == '\t') {
          ptr++;
          len--;
        }
      }
      if (cnt > 0) {
        for (cc = 0; cc < maxlen; cc++) {
          str << " ";
        }
      }
      CommandLineArguments::Internal::String::size_type skip = len;
      if (skip > this->LineLength - maxlen) {
        skip = this->LineLength - maxlen;
        for (cc = skip - 1; cc > 0; cc--) {
          if (ptr[cc] == ' ' || ptr[cc] == '\t') {
            break;
          }
        }
        if (cc != 0) {
          skip = cc;
        }
      }
      str.write(ptr, static_cast<std::streamsize>(skip));
      str << std::endl;
      ptr += skip;
      len -= skip;
      cnt++;
    }
  }
  /*
  // This can help debugging help string
  str << endl;
  unsigned int cc;
  for ( cc = 0; cc < this->LineLength; cc ++ )
    {
    str << cc % 10;
    }
  str << endl;
  */
  this->Help = str.str();
}